

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msd_dyn_vector.cpp
# Opt level: O2

void msd_D<vector_realloc_counter_clear<unsigned_char*,16u>,unsigned_short>
               (uchar **strings,size_t n,size_t depth,
               vector_realloc_counter_clear<unsigned_char_*,_16U> *buckets)

{
  ushort uVar1;
  uint j;
  long lVar2;
  size_t *psVar3;
  uchar **t;
  uint j_1;
  ulong n_00;
  uint i;
  uchar **t_00;
  long lVar4;
  ulong uVar5;
  array<unsigned_short,_256UL> bucketsize;
  
  if (n < 0x20) {
    insertion_sort(strings,(int)n,depth);
    return;
  }
  t_00 = strings;
  for (uVar5 = 0; uVar5 < (n & 0xffffffffffffffe0); uVar5 = uVar5 + 0x20) {
    for (lVar2 = 0; lVar2 != 0x20; lVar2 = lVar2 + 1) {
      *(uchar *)((long)bucketsize._M_elems + lVar2) = t_00[lVar2][depth];
    }
    t = t_00;
    for (lVar2 = 0; lVar2 != 0x20; lVar2 = lVar2 + 1) {
      vector_realloc_counter_clear<unsigned_char_*,_16U>::push_back
                (buckets + *(byte *)((long)bucketsize._M_elems + lVar2),t);
      t = t + 1;
    }
    t_00 = t_00 + 0x20;
  }
  for (; uVar5 < n; uVar5 = uVar5 + 1) {
    vector_realloc_counter_clear<unsigned_char_*,_16U>::push_back(buckets + (*t_00)[depth],t_00);
    t_00 = t_00 + 1;
  }
  psVar3 = &buckets->_size;
  for (lVar2 = 0; lVar2 != 0x100; lVar2 = lVar2 + 1) {
    bucketsize._M_elems[lVar2] = (unsigned_short)*psVar3;
    psVar3 = psVar3 + 3;
  }
  psVar3 = &buckets->_size;
  lVar4 = 0;
  for (lVar2 = 0; lVar2 != 0x100; lVar2 = lVar2 + 1) {
    uVar1 = bucketsize._M_elems[lVar2];
    if ((ulong)uVar1 != 0) {
      if (*psVar3 != 0) {
        memmove(strings + lVar4,
                ((vector_realloc_counter_clear<unsigned_char_*,_16U> *)(psVar3 + -1))->_data,
                *psVar3 << 3);
      }
      lVar4 = lVar4 + (ulong)uVar1;
    }
    psVar3 = psVar3 + 3;
  }
  for (lVar2 = 8; lVar2 != 0x1808; lVar2 = lVar2 + 0x18) {
    *(undefined8 *)((long)&buckets->_data + lVar2) = 0;
  }
  uVar5 = (ulong)bucketsize._M_elems[0];
  for (lVar2 = 1; lVar2 != 0x100; lVar2 = lVar2 + 1) {
    n_00 = (ulong)bucketsize._M_elems[lVar2];
    if (n_00 != 0) {
      msd_D<vector_realloc_counter_clear<unsigned_char*,16u>,unsigned_short>
                (strings + uVar5,n_00,depth + 1,buckets);
      uVar5 = uVar5 + n_00;
    }
  }
  return;
}

Assistant:

static void
msd_D(unsigned char** strings, size_t n, size_t depth, Bucket* buckets)
{
	if (n < 32) {
		insertion_sort(strings, n, depth);
		return;
	}
	// Use a small cache to reduce memory stalls.
	size_t i=0;
	for (; i < n-n%32; i+=32) {
		unsigned char cache[32];
		for (unsigned j=0; j < 32; ++j) {
			cache[j] = strings[i+j][depth];
		}
		for (unsigned j=0; j < 32; ++j) {
			buckets[cache[j]].push_back(strings[i+j]);
		}
	}
	for (; i < n; ++i) {
		buckets[strings[i][depth]].push_back(strings[i]);
	}
	std::array<BucketsizeType, 256> bucketsize;
	for (unsigned i=0; i < 256; ++i) {
		bucketsize[i] = buckets[i].size();
	}
	size_t pos = 0;
	for (unsigned i=0; i < 256; ++i) {
		if (bucketsize[i] == 0) continue;
		copy(buckets[i], strings+pos);
		pos += bucketsize[i];
	}
	for (unsigned i=0; i < 256; ++i) {
		buckets[i].clear();
	}
	pos = bucketsize[0];
	for (unsigned i=1; i < 256; ++i) {
		if (bucketsize[i] == 0) continue;
		msd_D<Bucket, BucketsizeType>(strings+pos, bucketsize[i], depth+1, buckets);
		pos += bucketsize[i];
	}
}